

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_53533::ParserImpl::ParseFunctionBody(ParserImpl *this)

{
  TokenDetail *pTVar1;
  undefined8 uVar2;
  void *pvVar3;
  __uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> in_RDI;
  ParserImpl *in_stack_00000008;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> block;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> param_list;
  int line;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_ffffffffffffff48;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *__p;
  ParserImpl *in_stack_ffffffffffffff50;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *this_00;
  int line_00;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_ffffffffffffff60;
  FunctionBody *in_stack_ffffffffffffff70;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> local_50;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> local_48;
  TokenDetail *in_stack_ffffffffffffffc0;
  ParserImpl *in_stack_ffffffffffffffc8;
  ParseException *in_stack_ffffffffffffffd0;
  
  LookAhead(in_stack_ffffffffffffff50);
  pTVar1 = NextToken(in_stack_ffffffffffffff50);
  if (pTVar1->token_ != 0x28) {
    uVar2 = __cxa_allocate_exception(0x20);
    luna::ParseException::ParseException
              (in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0
              );
    __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
  }
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<std::default_delete<luna::SyntaxTree>,void>
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_ffffffffffffff50);
  pTVar1 = LookAhead(in_stack_ffffffffffffff50);
  if (pTVar1->token_ != 0x29) {
    ParseParamList(in_stack_00000008);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator=
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              (in_stack_ffffffffffffff60);
  }
  pTVar1 = NextToken(in_stack_ffffffffffffff50);
  if (pTVar1->token_ != 0x29) {
    uVar2 = __cxa_allocate_exception(0x20);
    luna::ParseException::ParseException
              (in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0
              );
    __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
  }
  ParseBlock(in_stack_ffffffffffffffc8);
  pTVar1 = NextToken(in_stack_ffffffffffffff50);
  if (pTVar1->token_ != 0x105) {
    uVar2 = __cxa_allocate_exception(0x20);
    luna::ParseException::ParseException
              (in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0
              );
    __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
  }
  pvVar3 = operator_new(0x20);
  line_00 = (int)((ulong)pvVar3 >> 0x20);
  __p = &local_48;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_ffffffffffffff50,__p);
  this_00 = &local_50;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr(this_00,__p)
  ;
  luna::FunctionBody::FunctionBody
            (in_stack_ffffffffffffff70,
             (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pTVar1,
             in_stack_ffffffffffffff60,line_00);
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<std::default_delete<luna::SyntaxTree>,void>(this_00,(pointer)__p);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_ffffffffffffff60);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_ffffffffffffff60);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_ffffffffffffff60);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_ffffffffffffff60);
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
         in_RDI.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
         .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseFunctionBody()
        {
            int line = LookAhead().line_;
            if (NextToken().token_ != '(')
                throw ParseException("unexpect token after 'function', expect '('", current_);

            std::unique_ptr<SyntaxTree> param_list;

            if (LookAhead().token_ != ')')
                param_list = ParseParamList();

            if (NextToken().token_ != ')')
                throw ParseException("unexpect token after param list, expect ')'", current_);

            std::unique_ptr<SyntaxTree> block = ParseBlock();

            if (NextToken().token_ != Token_End)
                throw ParseException("unexpect token after function body, expect 'end'", current_);

            return std::unique_ptr<SyntaxTree>(new FunctionBody(std::move(param_list),
                                                                std::move(block), line));
        }